

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void __thiscall depspawn::Observer::~Observer(Observer *this)

{
  byte bVar1;
  initializer_list<depspawn::internal::Workitem_*> __l;
  bool bVar2;
  undefined8 *in_RDI;
  bool helped_here;
  bool helped;
  bool priority;
  Workitem *safe_end;
  bool must_reiterate;
  Workitem *p;
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  fathers;
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  *this_00;
  key_equal *in_stack_fffffffffffffed8;
  hasher *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  *in_stack_fffffffffffffef0;
  iterator in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  allocator_type *in_stack_ffffffffffffff10;
  _Node_iterator_base<depspawn::internal::Workitem_*,_false> local_c0;
  _Node_iterator_base<depspawn::internal::Workitem_*,_false> local_b8;
  byte local_aa;
  byte local_a9;
  __pointer_type local_a8;
  byte local_99;
  __pointer_type local_98;
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  local_8b;
  int local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 *local_20;
  int local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 *local_8;
  
  local_8b._M_h._3_8_ = in_RDI[1];
  local_8b._M_h._11_8_ = (long)&local_8b._M_h._M_buckets + 3;
  local_8b._M_h._19_8_ = 1;
  this_00 = &local_8b;
  std::allocator<depspawn::internal::Workitem_*>::allocator
            ((allocator<depspawn::internal::Workitem_*> *)0x127bd6);
  __l._M_len = in_stack_ffffffffffffff00;
  __l._M_array = in_stack_fffffffffffffef8;
  std::
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  ::unordered_set(in_stack_fffffffffffffef0,__l,
                  CONCAT17(in_stack_fffffffffffffeef,
                           CONCAT16(in_stack_fffffffffffffeee,
                                    CONCAT15(in_stack_fffffffffffffeed,
                                             CONCAT14(in_stack_fffffffffffffeec,
                                                      in_stack_fffffffffffffee8)))),
                  in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_ffffffffffffff10);
  std::allocator<depspawn::internal::Workitem_*>::~allocator
            ((allocator<depspawn::internal::Workitem_*> *)0x127c21);
  local_20 = &(anonymous_namespace)::ObserversAtWork;
  local_24 = 1;
  local_28 = 5;
  local_2c = 1;
  LOCK();
  local_30 = (anonymous_namespace)::ObserversAtWork;
  UNLOCK();
  (anonymous_namespace)::ObserversAtWork = (anonymous_namespace)::ObserversAtWork + 1;
  do {
    bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffed8);
  } while (bVar2);
  if (in_RDI[1] == 0) {
    local_a8 = (__pointer_type)0x0;
  }
  else {
    local_a8 = (__pointer_type)*in_RDI;
  }
  local_a9 = 1;
  do {
    local_99 = 0;
    local_aa = 0;
    for (local_98 = std::atomic::operator_cast_to_Workitem_
                              ((atomic<depspawn::internal::Workitem_*> *)0x127d6f);
        local_98 != local_a8; local_98 = local_98->next) {
      local_b8._M_cur =
           (__node_type *)
           std::
           unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
           ::find(this_00,(key_type *)0x127da6);
      local_c0._M_cur =
           (__node_type *)
           std::
           unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
           ::end(this_00);
      bVar2 = std::__detail::operator!=(&local_b8,&local_c0);
      if (bVar2) {
        std::
        unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
        ::insert((unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
                  *)in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
        if ((short)local_98->status < 4) {
          local_99 = 1;
          bVar2 = anon_unknown.dwarf_c846::try_to_run((Workitem *)0x127e40);
          bVar1 = local_aa & 1;
          local_aa = 1;
          if (bVar1 == 0) {
            local_aa = bVar2;
          }
        }
      }
      else if ((local_a9 & 1) == 0) {
        anon_unknown.dwarf_c846::try_to_run((Workitem *)0x127e8e);
      }
    }
    if ((local_aa & 1) == 0) {
      local_a9 = *(byte *)(in_RDI + 2);
    }
    local_a9 = local_a9 & 1;
  } while ((local_99 & 1) != 0);
  local_8 = &(anonymous_namespace)::ObserversAtWork;
  local_c = 1;
  local_10 = 5;
  local_14 = 1;
  LOCK();
  UNLOCK();
  local_18 = (anonymous_namespace)::ObserversAtWork;
  (anonymous_namespace)::ObserversAtWork = (anonymous_namespace)::ObserversAtWork + -1;
  std::
  unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
  ::~unordered_set((unordered_set<depspawn::internal::Workitem_*,_std::hash<depspawn::internal::Workitem_*>,_std::equal_to<depspawn::internal::Workitem_*>,_std::allocator<depspawn::internal::Workitem_*>_>
                    *)0x127fe9);
  return;
}

Assistant:

Observer::~Observer()
  { std::unordered_set<internal::Workitem *> fathers({cur_father_});
    internal::Workitem *p;
    bool must_reiterate;
    
    ObserversAtWork.fetch_add(1); //disable future attempts to erase Workitems during my activity
    while (eraser_assigned) {
      // Wait for current eraser, if any, to finish
    }
    
    /* if there was a cur_father_, since we are inside it, and limit_ is it or more recent,
     limit_ cannot have been deallocated, so limit_ is a safe limit.
     
     if cur_father_=null and limit_ was deallocated, all previous tasks finished,
     and so we have to execute everything up to the end of the list, which is cur_father_=null.
     
     if cur_father_=null and limit_ was not deallocated, we have to execute
     everything up to limit_, but it could have been deallocated, so null is a safe limit,
     although we are waiting for more task that we should actually do.
     
     Also it is interesting to notice that no Workitem in the high-level critical path can
     be Filling, but Workitems descended from them could.
     */
    
    internal::Workitem * const safe_end = (cur_father_ != nullptr) ? limit_ : nullptr;
    //printf("%p w until %p!=NULL->%p\n", enum_thr_spec_father, cur_father_, limit_);

    //The first round always has priority, i.e., is only devoted to the critical path
    bool priority = true;

    do {
      must_reiterate = false;
      bool helped = false;
  
      // We must begin from worklist because new work we must do may have been spawned
      for (p = worklist; p != safe_end; p = p->next) {
        if (fathers.find(p->father) != fathers.end()) { //Workitem in the critical path
          fathers.insert(p); //it could be the father of other tasks that would have to finish
          if (p->status < Workitem::Status_t::Done) {
            must_reiterate = true;
            bool helped_here = try_to_run(p);
            helped = helped || helped_here;
          }
        } else {
          if (!priority) {
            try_to_run(p);
          }
        }
      }
      
      // While we are able to help with tasks in the critical path, we remain focused on it.
      // Otherwise we adopt the priority specified by the user.
      priority = helped ? priority : priority_;
      
    } while (must_reiterate);
    
    //printf("%p exit\n", enum_thr_spec_father);
    
    ObserversAtWork.fetch_sub(1); //I'm done
  }